

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

void duckdb_je_sc_data_update_slab_size(sc_data_t *data,size_t begin,size_t end,int pgs)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  iVar1 = data->nsizes;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if ((&data->sc[0].bin)[lVar3] != true) {
        return;
      }
      uVar4 = ((long)*(int *)((long)&data->sc[0].ndelta + lVar3) <<
              (*(byte *)((long)&data->sc[0].lg_delta + lVar3) & 0x3f)) +
              (1L << (*(byte *)((long)&data->sc[0].lg_base + lVar3) & 0x3f));
      if (uVar4 <= end && begin <= uVar4) {
        uVar2 = ((uVar4 >> 0xc) + 1) - (ulong)((uVar4 & 0xfff) == 0);
        if ((ulong)(long)pgs < uVar2) {
          *(int *)((long)&data->sc[0].pgs + lVar3) = (int)uVar2;
        }
        else if ((uVar4 >> 3 & 0xfffffffffffff) < (ulong)(long)pgs) {
          *(int *)((long)&data->sc[0].pgs + lVar3) = (int)(uVar4 >> 3);
        }
        else {
          *(int *)((long)&data->sc[0].pgs + lVar3) = pgs;
        }
      }
      lVar3 = lVar3 + 0x1c;
    } while ((long)iVar1 * 0x1c != lVar3);
  }
  return;
}

Assistant:

void
sc_data_update_slab_size(sc_data_t *data, size_t begin, size_t end, int pgs) {
	assert(data->initialized);
	for (int i = 0; i < data->nsizes; i++) {
		sc_t *sc = &data->sc[i];
		if (!sc->bin) {
			break;
		}
		size_t reg_size = reg_size_compute(sc->lg_base, sc->lg_delta,
		    sc->ndelta);
		if (begin <= reg_size && reg_size <= end) {
			sc_data_update_sc_slab_size(sc, reg_size, pgs);
		}
	}
}